

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O3

int __thiscall NaPetriNet::unlink(NaPetriNet *this,char *__name)

{
  int extraout_EAX;
  NaPetriNode *pNVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 *puVar6;
  NaPetriConnector *in_RDX;
  
  if ((__name != (char *)0x0) && (in_RDX != (NaPetriConnector *)0x0)) {
    (**(code **)(*(long *)__name + 0x60))(__name);
    (*in_RDX->_vptr_NaPetriConnector[0xc])();
    pNVar1 = NaPetriConnector::host((NaPetriConnector *)__name);
    pcVar2 = NaPetriNode::name(pNVar1);
    pcVar3 = NaPetriConnector::name((NaPetriConnector *)__name);
    pNVar1 = NaPetriConnector::host(in_RDX);
    pcVar4 = NaPetriNode::name(pNVar1);
    pcVar5 = NaPetriConnector::name(in_RDX);
    NaPrintLog("Unlink %s.%s & %s.%s\n",pcVar2,pcVar3,pcVar4,pcVar5);
    return extraout_EAX;
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&NaException::typeinfo,0);
}

Assistant:

void
NaPetriNet::unlink (NaPetriConnector* pcSrc, NaPetriConnector* pcDst)
{
    if(NULL == pcSrc || NULL == pcDst)
        throw(na_null_pointer);

    pcSrc->unlink(pcDst);
    pcDst->unlink(pcSrc);

    NaPrintLog("Unlink %s.%s & %s.%s\n",
               pcSrc->host()->name(), pcSrc->name(),
               pcDst->host()->name(), pcDst->name());
}